

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O2

uint32_t cppcms::utf8::next<char_const*>(char **p,char *e,bool html,bool param_4)

{
  byte c;
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  pbVar1 = (byte *)*p;
  uVar5 = 0xffffffff;
  uVar6 = uVar5;
  if (pbVar1 != (byte *)e) {
    *p = (char *)(pbVar1 + 1);
    c = *pbVar1;
    iVar2 = trail_length(c);
    if (-1 < iVar2) {
      uVar6 = (uint32_t)c;
      if (iVar2 == 0) {
        if (((html) && (c < 0x20 || c == 0x7f)) && (uVar6 = uVar5, (byte)(c - 9) < 5)) {
          uVar6 = *(uint32_t *)(&DAT_00266fe8 + (ulong)(byte)(c - 9) * 4);
        }
      }
      else {
        uVar5 = 0xffffffff;
        uVar4 = ~(-1 << (6U - (char)iVar2 & 0x1f)) & uVar6;
        uVar6 = uVar5;
        if (iVar2 == 3) {
          if (*p != e) {
            *p = *p + 1;
          }
        }
        else if (iVar2 == 2) {
          if (*p != e) {
            *p = *p + 1;
          }
        }
        else if (iVar2 == 1) {
          if (*p != e) {
            *p = *p + 1;
          }
        }
        else if (uVar4 < 0x110000) {
          if (uVar4 < 0x80) {
            iVar3 = 1;
          }
          else if (uVar4 < 0x800) {
            iVar3 = 2;
          }
          else {
            iVar3 = 4 - (uint)(uVar4 < 0x10000);
          }
          if (iVar3 == iVar2 + 1) {
            if (!html) {
              uVar5 = uVar4;
            }
            uVar6 = uVar5;
            if (0x9f < uVar4) {
              uVar6 = uVar4;
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

uint32_t next(Iterator &p,Iterator e,bool html=false,bool /*decode*/=false)
	{
		using utf::illegal;
		if(p==e)
			return illegal;

		unsigned char lead = *p++;

		// First byte is fully validated here
		int trail_size = trail_length(lead);

		if(trail_size < 0)
			return illegal;

		//
		// Ok as only ASCII may be of size = 0
		// also optimize for ASCII text
		//
		if(trail_size == 0) {
			if(!html || (lead >= 0x20 && lead!=0x7F) || lead==0x9 || lead==0x0A || lead==0x0D)
				return lead;
			return illegal;
		}

		uint32_t c = lead & ((1<<(6-trail_size))-1);

		// Read the rest
		unsigned char tmp;
		switch(trail_size) {
			case 3:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 2:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 1:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
		}

		// Check code point validity: no surrogates and
		// valid range
		if(!utf::valid(c))
			return illegal;

		// make sure it is the most compact representation
		if(width(c)!=trail_size + 1)
			return illegal;
		
		if(html && c<0xA0)
			return illegal;
		return c;
	}